

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.h
# Opt level: O0

void __thiscall aiCamera::GetCameraMatrix(aiCamera *this,aiMatrix4x4 *out)

{
  float fVar1;
  float fVar2;
  aiVector3t<float> aVar3;
  aiVector3t<float> local_58;
  undefined1 local_44 [8];
  aiVector3D xaxis;
  aiVector3D yaxis;
  float fStack_24;
  aiVector3D zaxis;
  aiMatrix4x4 *out_local;
  aiCamera *this_local;
  
  fVar1 = (this->mLookAt).z;
  yaxis.z = (this->mLookAt).x;
  fStack_24 = (this->mLookAt).y;
  aiVector3t<float>::Normalize((aiVector3t<float> *)&yaxis.z);
  yaxis.x = (this->mUp).z;
  xaxis.y = (this->mUp).x;
  xaxis.z = (this->mUp).y;
  aiVector3t<float>::Normalize((aiVector3t<float> *)&xaxis.y);
  aVar3 = operator^(&this->mUp,&this->mLookAt);
  local_58._0_8_ = aVar3._0_8_;
  local_44._0_4_ = local_58.x;
  local_44._4_4_ = local_58.y;
  local_58.z = aVar3.z;
  xaxis.x = local_58.z;
  aiVector3t<float>::Normalize((aiVector3t<float> *)local_44);
  fVar2 = ::operator*((aiVector3t<float> *)local_44,&this->mPosition);
  out->a4 = -fVar2;
  fVar2 = ::operator*((aiVector3t<float> *)&xaxis.y,&this->mPosition);
  out->b4 = -fVar2;
  fVar2 = ::operator*((aiVector3t<float> *)&yaxis.z,&this->mPosition);
  out->c4 = -fVar2;
  out->a1 = (float)local_44._0_4_;
  out->a2 = (float)local_44._4_4_;
  out->a3 = xaxis.x;
  out->b1 = xaxis.y;
  out->b2 = xaxis.z;
  out->b3 = yaxis.x;
  out->c1 = yaxis.z;
  out->c2 = fStack_24;
  out->c3 = fVar1;
  out->d3 = 0.0;
  out->d2 = 0.0;
  out->d1 = 0.0;
  out->d4 = 1.0;
  return;
}

Assistant:

void GetCameraMatrix (aiMatrix4x4& out) const
    {
        /** todo: test ... should work, but i'm not absolutely sure */

        /** We don't know whether these vectors are already normalized ...*/
        aiVector3D zaxis = mLookAt;     zaxis.Normalize();
        aiVector3D yaxis = mUp;         yaxis.Normalize();
        aiVector3D xaxis = mUp^mLookAt; xaxis.Normalize();

        out.a4 = -(xaxis * mPosition);
        out.b4 = -(yaxis * mPosition);
        out.c4 = -(zaxis * mPosition);

        out.a1 = xaxis.x;
        out.a2 = xaxis.y;
        out.a3 = xaxis.z;

        out.b1 = yaxis.x;
        out.b2 = yaxis.y;
        out.b3 = yaxis.z;

        out.c1 = zaxis.x;
        out.c2 = zaxis.y;
        out.c3 = zaxis.z;

        out.d1 = out.d2 = out.d3 = 0.f;
        out.d4 = 1.f;
    }